

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

Matcher<const_pstore::command_line::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_&>
* __thiscall
testing::internal::ElementsAreMatcher::operator_cast_to_Matcher
          (Matcher<const_pstore::command_line::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_&>
           *__return_storage_ptr__,ElementsAreMatcher *this)

{
  ElementsAreMatcherImpl<pstore::command_line::list<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>const&>
  *this_00;
  undefined4 *puVar1;
  MatcherVec matchers;
  IterateOverTuple<std::tuple<const_char_*,_const_char_*,_const_char_*,_const_char_*>,_4UL> local_29
  ;
  vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
  local_28;
  
  local_28.
  super__Vector_base<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        *)0x0;
  local_28.
  super__Vector_base<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        *)0x0;
  local_28.
  super__Vector_base<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
  ::reserve(&local_28,4);
  TransformTupleValuesHelper<std::tuple<const_char_*,_const_char_*,_const_char_*,_const_char_*>,_testing::internal::CastAndAppendTransform<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::back_insert_iterator<std::vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>_>_>
  ::IterateOverTuple<std::tuple<const_char_*,_const_char_*,_const_char_*,_const_char_*>,_4UL>::
  operator()(&local_29,this,&local_28);
  this_00 = (ElementsAreMatcherImpl<pstore::command_line::list<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>const&>
             *)operator_new(0x20);
  ElementsAreMatcherImpl<pstore::command_line::list<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>const&>
  ::
  ElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<std::__cxx11::string_const&>*,std::vector<testing::Matcher<std::__cxx11::string_const&>,std::allocator<testing::Matcher<std::__cxx11::string_const&>>>>>
            (this_00,(__normal_iterator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_std::vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>_>
                      )local_28.
                       super__Vector_base<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*,_std::vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>_>
              )local_28.
               super__Vector_base<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  (__return_storage_ptr__->
  super_MatcherBase<const_pstore::command_line::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_&>
  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001ad760;
  (__return_storage_ptr__->
  super_MatcherBase<const_pstore::command_line::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_&>
  ).vtable_ = (VTable *)
              MatcherBase<pstore::command_line::list<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>const&>
              ::
              GetVTable<testing::internal::MatcherBase<pstore::command_line::list<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>const&>::ValuePolicy<testing::MatcherInterface<pstore::command_line::list<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>const&>const*,true>>()
              ::kVTable_abi_cxx11_;
  puVar1 = (undefined4 *)operator_new(0x10);
  *puVar1 = 1;
  *(ElementsAreMatcherImpl<pstore::command_line::list<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>const&>
    **)(puVar1 + 2) = this_00;
  (__return_storage_ptr__->
  super_MatcherBase<const_pstore::command_line::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_&>
  ).buffer_.ptr = puVar1;
  (__return_storage_ptr__->
  super_MatcherBase<const_pstore::command_line::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_&>
  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001ad6f0;
  std::
  vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
  ::~vector(&local_28);
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Container>() const {
    GTEST_COMPILE_ASSERT_(
        !IsHashTable<GTEST_REMOVE_REFERENCE_AND_CONST_(Container)>::value ||
            ::std::tuple_size<MatcherTuple>::value < 2,
        use_UnorderedElementsAre_with_hash_tables);

    typedef GTEST_REMOVE_REFERENCE_AND_CONST_(Container) RawContainer;
    typedef typename internal::StlContainerView<RawContainer>::type View;
    typedef typename View::value_type Element;
    typedef ::std::vector<Matcher<const Element&> > MatcherVec;
    MatcherVec matchers;
    matchers.reserve(::std::tuple_size<MatcherTuple>::value);
    TransformTupleValues(CastAndAppendTransform<const Element&>(), matchers_,
                         ::std::back_inserter(matchers));
    return Matcher<Container>(new ElementsAreMatcherImpl<const Container&>(
        matchers.begin(), matchers.end()));
  }